

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 挑7.cpp
# Opt level: O2

int main(void)

{
  long *plVar1;
  long lVar2;
  ostream *poVar3;
  uint __val;
  int iVar4;
  int iVar5;
  uint uVar6;
  int n;
  string local_50;
  
  while( true ) {
    plVar1 = (long *)std::istream::operator>>((istream *)&std::cin,&n);
    if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) break;
    iVar5 = 0;
    iVar4 = -6;
    __val = 6;
    while( true ) {
      if (n < (int)__val) break;
      uVar6 = 1;
      if ((__val / 7) * 7 + iVar4 != 0) {
        std::__cxx11::to_string(&local_50,__val);
        lVar2 = std::__cxx11::string::find((char)&local_50,0x37);
        uVar6 = (uint)(lVar2 != -1);
        std::__cxx11::string::~string((string *)&local_50);
      }
      iVar5 = iVar5 + uVar6;
      __val = __val + 1;
      iVar4 = iVar4 + -1;
    }
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return 0;
}

Assistant:

int main()
{
    int n;
    while(cin>>n)
    {
        int sum(0);
        for (int i=6;i<n+1;i++)
        {
            if(i%7 == 0 || to_string(i).find('7') != -1)
                sum++;
        }

        cout<<sum<<endl;
        //cout<<stoi("23454")<<endl;
        //stox,以及to_string两个函数都是std中的成员，不需要其他头文件引用
    }
    return 0;
}